

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int OptInit(char **a,s_options *o,FILE *err)

{
  option_type oVar1;
  char *__s1;
  code *pcVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  s_options *psVar7;
  char *pcVar8;
  undefined4 uVar9;
  long lVar10;
  int iVar11;
  char **ppcVar12;
  int n;
  long lVar13;
  double dVar14;
  char *local_40;
  char **local_38;
  
  g_argv = a;
  op = o;
  errstream = err;
  if ((((a != (char **)0x0) && (o != (s_options *)0x0)) && (*a != (char *)0x0)) &&
     (pcVar8 = a[1], pcVar8 != (char *)0x0)) {
    lVar13 = 1;
    iVar11 = 0;
    local_38 = a;
    do {
      ppcVar12 = g_argv;
      n = (int)lVar13;
      if ((*pcVar8 == '-') || (*pcVar8 == '+')) {
        pcVar8 = op->label;
        if (pcVar8 != (char *)0x0) {
          pcVar5 = g_argv[lVar13];
          psVar7 = op;
          do {
            sVar4 = strlen(pcVar8);
            iVar3 = strncmp(pcVar5 + 1,pcVar8,(long)(int)sVar4);
            if (iVar3 == 0) {
              if (psVar7->label != (char *)0x0) {
                pcVar2 = (code *)psVar7->arg;
                iVar3 = 0;
                if (pcVar2 == (code *)0x0) goto LAB_00104ebc;
                oVar1 = psVar7->type;
                if (oVar1 == OPT_FSTR) {
                  (*pcVar2)(pcVar5 + 2);
                  goto LAB_00104ebc;
                }
                if (oVar1 == OPT_FFLAG) {
                  (*pcVar2)();
                  goto LAB_00104ebc;
                }
                if (oVar1 == OPT_FLAG) {
                  *(uint *)pcVar2 = (uint)(*pcVar5 == '-');
                  goto LAB_00104ebc;
                }
                if (err == (FILE *)0x0) goto LAB_00104eb7;
                pcVar8 = "%smissing argument on switch.\n";
                goto LAB_00104cd4;
              }
              break;
            }
            pcVar8 = psVar7[1].label;
            psVar7 = psVar7 + 1;
          } while (pcVar8 != (char *)0x0);
        }
        if (err == (FILE *)0x0) {
LAB_00104eb7:
          iVar3 = 1;
        }
        else {
          pcVar8 = "%sundefined option.\n";
LAB_00104cd4:
          fprintf((FILE *)err,pcVar8,emsg);
          iVar3 = 1;
          errline(n,1,err);
        }
LAB_00104ebc:
        iVar11 = iVar11 + iVar3;
      }
      else {
        pcVar8 = strchr(pcVar8,0x3d);
        if (pcVar8 != (char *)0x0) {
          pcVar5 = strchr(ppcVar12[lVar13],0x3d);
          *pcVar5 = '\0';
          psVar7 = op;
          pcVar8 = op->label;
          if (pcVar8 == (char *)0x0) {
            lVar10 = 0;
          }
          else {
            __s1 = ppcVar12[lVar13];
            ppcVar12 = &op[1].label;
            lVar10 = 0;
            do {
              iVar3 = strcmp(__s1,pcVar8);
              if (iVar3 == 0) break;
              lVar10 = lVar10 + 1;
              pcVar8 = *ppcVar12;
              ppcVar12 = ppcVar12 + 4;
            } while (pcVar8 != (char *)0x0);
          }
          *pcVar5 = '=';
          if (psVar7[lVar10].label == (char *)0x0) {
            iVar3 = 1;
            if (err != (FILE *)0x0) {
              fprintf((FILE *)err,"%sundefined option.\n",emsg);
              errline(n,0,err);
            }
          }
          else {
            oVar1 = psVar7[lVar10].type;
            dVar14 = 0.0;
            if (oVar1 - OPT_FLAG < 8) {
              pcVar5 = pcVar5 + 1;
              switch(oVar1) {
              default:
                if (err != (FILE *)0x0) {
                  fprintf((FILE *)err,"%soption requires an argument.\n",emsg);
                  errline(n,0,err);
                  dVar14 = 0.0;
                }
                break;
              case OPT_INT:
              case OPT_FINT:
                iVar3 = 0;
                lVar6 = strtol(pcVar5,&local_40,0);
                pcVar8 = local_40;
                if ((*local_40 != '\0') && (iVar3 = 1, err != (FILE *)0x0)) {
                  fprintf((FILE *)err,"%sillegal character in integer argument.\n",emsg);
                  errline(n,(int)pcVar8 - *(int *)(g_argv + lVar13),err);
                }
                uVar9 = (undefined4)lVar6;
                pcVar5 = (char *)0x0;
                dVar14 = 0.0;
                goto LAB_00104ecf;
              case OPT_DBL:
              case OPT_FDBL:
                dVar14 = strtod(pcVar5,&local_40);
                pcVar8 = local_40;
                if (*local_40 == '\0') goto LAB_00104eca;
                if (err != (FILE *)0x0) {
                  fprintf((FILE *)err,"%sillegal character in floating-point argument.\n",emsg);
                  errline(n,(int)pcVar8 - *(int *)(g_argv + lVar13),err);
                }
                break;
              case OPT_STR:
              case OPT_FSTR:
                goto switchD_00104d3b_caseD_4;
              }
              uVar9 = 0;
              iVar3 = 1;
              pcVar5 = (char *)0x0;
            }
            else {
LAB_00104eca:
              pcVar5 = (char *)0x0;
switchD_00104d3b_caseD_4:
              uVar9 = 0;
              iVar3 = 0;
            }
LAB_00104ecf:
            switch(op[lVar10].type) {
            case OPT_INT:
              *(undefined4 *)op[lVar10].arg = uVar9;
              break;
            case OPT_DBL:
              *(double *)op[lVar10].arg = dVar14;
              break;
            case OPT_STR:
              *(char **)op[lVar10].arg = pcVar5;
              break;
            case OPT_FINT:
              (*(code *)op[lVar10].arg)();
              break;
            case OPT_FDBL:
              (*(code *)op[lVar10].arg)();
              break;
            case OPT_FSTR:
              (*(code *)op[lVar10].arg)(pcVar5);
            }
          }
          iVar11 = iVar3 + iVar11;
        }
      }
      pcVar8 = g_argv[lVar13 + 1];
      lVar13 = lVar13 + 1;
    } while (pcVar8 != (char *)0x0);
    if (0 < iVar11) {
      fprintf((FILE *)err,"Valid command line options for \"%s\" are:\n",*local_38);
      OptPrint();
      exit(1);
    }
  }
  return 0;
}

Assistant:

int OptInit(char **a, struct s_options *o, FILE *err)
{
  int errcnt = 0;
  g_argv = a;
  op = o;
  errstream = err;
  if( g_argv && *g_argv && op ){
    int i;
    for(i=1; g_argv[i]; i++){
      if( g_argv[i][0]=='+' || g_argv[i][0]=='-' ){
        errcnt += handleflags(i,err);
      }else if( strchr(g_argv[i],'=') ){
        errcnt += handleswitch(i,err);
      }
    }
  }
  if( errcnt>0 ){
    fprintf(err,"Valid command line options for \"%s\" are:\n",*a);
    OptPrint();
    exit(1);
  }
  return 0;
}